

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void compileval(vector<unsigned_int> *code,int wordtype,char *word,int wordlen)

{
  byte *pbVar1;
  uint uVar2;
  ident *piVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  float fVar8;
  double dVar9;
  anon_union_4_2_94730053 end;
  undefined8 local_38;
  uint local_2c;
  
  if (6 < wordtype - 1U) {
    return;
  }
  iVar6 = (&switchD_00132926::switchdataD_00165f50)[wordtype - 1U] + 0x165f50;
  switch(wordtype) {
  case 1:
    if (word == (char *)0x0) {
      iVar6 = 0;
    }
    else {
      lVar4 = strtol(word,(char **)0x0,0);
      iVar6 = (int)lVar4;
      if (0xffffff < iVar6 + 0x800000U) {
        local_38._0_4_ = 0x45;
        vector<unsigned_int>::add(code,(uint *)&local_38);
        local_38 = (byte *)CONCAT44(local_38._4_4_,iVar6);
        break;
      }
    }
    local_38 = (byte *)(CONCAT44(local_38._4_4_,iVar6 << 8) | 0x46);
    break;
  case 2:
    if (word == (char *)0x0) {
      fVar8 = 0.0;
    }
    else {
      dVar9 = strtod(word,(char **)&local_38);
      if ((((dVar9 != 0.0) || (NAN(dVar9))) || (local_38 == (byte *)word)) ||
         ((*local_38 | 0x20) != 0x78)) {
        fVar8 = (float)dVar9;
      }
      else {
        lVar4 = strtol(word,(char **)0x0,0);
        fVar8 = (float)(int)lVar4;
      }
    }
    if ((fVar8 <= 8388607.0) && (-8388608.0 <= fVar8)) {
      if ((fVar8 == (float)(int)fVar8) && (!NAN(fVar8) && !NAN((float)(int)fVar8))) {
        uVar2 = (int)fVar8 << 8 | 0x86;
        goto LAB_00132bdc;
      }
    }
    local_38 = (byte *)CONCAT44(local_38._4_4_,fVar8);
    local_2c = 0x85;
    vector<unsigned_int>::add(code,&local_2c);
    break;
  case 3:
    local_38 = (byte *)(CONCAT44(local_38._4_4_,wordlen << 8) | 7);
    vector<unsigned_int>::add(code,(uint *)&local_38);
    vector<unsigned_int>::put(code,(uint *)word,wordlen >> 2);
    local_38 = (byte *)((ulong)local_38 & 0xffffffff00000000);
    memcpy(&local_38,word + ((long)wordlen - (ulong)(wordlen & 3)),(ulong)(wordlen & 3));
    break;
  case 4:
    if (wordlen < 4) {
      if (wordlen < 1) {
        uVar2 = 0xc6;
      }
      else {
        uVar2 = 0xc6;
        bVar5 = 8;
        uVar7 = 0;
        do {
          pbVar1 = (byte *)(word + uVar7);
          uVar7 = uVar7 + 1;
          uVar2 = uVar2 | (uint)*pbVar1 << (bVar5 & 0x1f);
          bVar5 = bVar5 + 8;
        } while ((uint)wordlen != uVar7);
      }
      goto LAB_00132bdc;
    }
    local_38 = (byte *)(CONCAT44(local_38._4_4_,wordlen << 8) | 0xc5);
    vector<unsigned_int>::add(code,(uint *)&local_38);
    vector<unsigned_int>::put(code,(uint *)word,(uint)wordlen >> 2);
    local_38 = (byte *)((ulong)local_38 & 0xffffffff00000000);
    memcpy(&local_38,word + ((ulong)(uint)wordlen - (ulong)(wordlen & 3)),(ulong)(wordlen & 3));
    break;
  case 5:
    uVar2 = code->ulen;
    local_38._0_4_ = 9;
    vector<unsigned_int>::add(code,(uint *)&local_38);
    local_38 = (byte *)CONCAT44(local_38._4_4_,uVar2 * 0x100 + 0x201);
    vector<unsigned_int>::add(code,(uint *)&local_38);
    local_38 = (byte *)word;
    compilestatements(code,(char **)&local_38,0,iVar6);
    local_2c = 0xc4;
    vector<unsigned_int>::add(code,&local_2c);
    code->buf[(int)uVar2] = code->buf[(int)uVar2] | (~uVar2 + code->ulen) * 0x100;
    return;
  case 6:
    goto switchD_00132926_caseD_6;
  case 7:
    piVar3 = dummyident;
    if (word != (char *)0x0) {
      piVar3 = newident(word,0x20);
    }
    uVar2 = piVar3->index * 0x100 + (uint)(piVar3->index < 0x19) * 2 + 0xd;
LAB_00132bdc:
    local_38 = (byte *)CONCAT44(local_38._4_4_,uVar2);
  }
  vector<unsigned_int>::add(code,(uint *)&local_38);
switchD_00132926_caseD_6:
  return;
}

Assistant:

static inline void compileval(vector<uint> &code, int wordtype, char *word, int wordlen)
{
    switch(wordtype)
    {
        case VAL_STR: compilestr(code, word, wordlen, true); break;
        case VAL_ANY: compilestr(code, word, wordlen); break;
        case VAL_FLOAT: compilefloat(code, word); break;
        case VAL_INT: compileint(code, word); break;
        case VAL_CODE:
        {
            int start = code.length();
            code.add(CODE_BLOCK);
            code.add(CODE_OFFSET|((start+2)<<8));
            const char *p = word;
            compilestatements(code, p, VAL_ANY);
            code.add(CODE_EXIT|RET_STR);
            code[start] |= uint(code.length() - (start + 1))<<8;
            break;
        }
        case VAL_IDENT: compileident(code, word); break;
        default:
            break;
    }
}